

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

Vec_Int_t * Gia_AigerReadMappingDoc(uchar **ppPos,int nObjs)

{
  byte bVar1;
  int *piVar2;
  uchar *puVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar9 = (ulong)(uint)nObjs;
  puVar3 = *ppPos;
  lVar6 = 0;
  iVar8 = 0;
  do {
    uVar14 = iVar8 * 0x100;
    bVar1 = puVar3[lVar6];
    iVar8 = uVar14 + bVar1;
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  *ppPos = puVar3 + 4;
  lVar6 = 0;
  uVar5 = 0;
  do {
    uVar5 = (uint)(puVar3 + 4)[lVar6] | uVar5 << 8;
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  *ppPos = puVar3 + 8;
  piVar2 = (int *)calloc((long)(int)((uVar5 + 2) * iVar8 + nObjs),4);
  if (0 < iVar8) {
    puVar3 = *ppPos;
    uVar5 = 0;
    do {
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar7 = (long)((int)uVar7 << 8) | (ulong)puVar3[lVar6];
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 4);
      *ppPos = puVar3 + 4;
      lVar6 = 0;
      uVar10 = 0;
      do {
        uVar10 = (uint)(puVar3 + 4)[lVar6] | uVar10 << 8;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 4);
      puVar3 = puVar3 + 8;
      *ppPos = puVar3;
      iVar8 = (int)uVar9;
      piVar2[uVar7] = iVar8;
      piVar2[iVar8] = uVar10;
      uVar12 = (ulong)(iVar8 + 1U);
      if (0 < (int)uVar10) {
        uVar11 = 0;
        uVar12 = (long)(int)(iVar8 + 1U);
        do {
          uVar9 = uVar12;
          lVar6 = 0;
          uVar13 = 0;
          do {
            uVar13 = (uint)puVar3[lVar6] | uVar13 << 8;
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 != 4);
          piVar2[uVar9] = uVar13;
          puVar3 = puVar3 + 4;
          *ppPos = puVar3;
          uVar11 = uVar11 + 1;
          uVar12 = uVar9 + 1;
        } while (uVar11 != uVar10);
      }
      nObjs = (int)uVar9 + 2;
      uVar9 = (ulong)(uint)nObjs;
      piVar2[(int)uVar12] = (int)uVar7;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar14 | bVar1));
  }
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = nObjs;
  pVVar4->nCap = nObjs;
  pVVar4->pArray = piVar2;
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_AigerReadMappingDoc( unsigned char ** ppPos, int nObjs )
{
    int * pMapping, nLuts, LutSize, iRoot, nFanins, i, k, nOffset;
    nLuts    = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    LutSize  = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    pMapping = ABC_CALLOC( int, nObjs + (LutSize + 2) * nLuts );
    nOffset = nObjs;
    for ( i = 0; i < nLuts; i++ )
    {
        iRoot   = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        nFanins = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        pMapping[iRoot] = nOffset;
        // write one
        pMapping[ nOffset++ ] = nFanins; 
        for ( k = 0; k < nFanins; k++ )
        {
            pMapping[ nOffset++ ] = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        }
        pMapping[ nOffset++ ] = iRoot; 
    }
    return Vec_IntAllocArray( pMapping, nOffset );
}